

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O1

int32 read_reg_mat(char *regmatfn,uint32 **veclen,uint32 *n_class,uint32 *n_stream,float32 *****A,
                  float32 ****B)

{
  uint32 *puVar1;
  int32 iVar2;
  FILE *pFVar3;
  float32 ****ppppfVar4;
  float32 ***pppfVar5;
  float32 **ppfVar6;
  float32 *pfVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32 nstream;
  uint32 nclass;
  float32 dummy;
  uint local_a4;
  float32 ***local_a0;
  FILE *local_98;
  ulong local_90;
  uint *local_88;
  uint local_7c;
  uint32 *local_78;
  float32 ****local_70;
  ulong local_68;
  float32 *****local_60;
  float32 ****local_58;
  uint32 **local_50;
  uint32 *local_48;
  uint32 *local_40;
  undefined1 local_34 [4];
  
  local_40 = n_class;
  pFVar3 = fopen(regmatfn,"r");
  if (pFVar3 == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x66,"Unable to open %s to read MLLR matrices\n",regmatfn);
    iVar2 = -1;
  }
  else {
    local_50 = veclen;
    local_48 = n_stream;
    __isoc99_fscanf(pFVar3,"%d",&local_7c);
    __isoc99_fscanf(pFVar3,"%d",&local_a4);
    local_98 = pFVar3;
    local_78 = (uint32 *)
               __ckd_calloc__((ulong)local_a4,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                              ,0x6c);
    ppppfVar4 = (float32 ****)
                __ckd_calloc_2d__((ulong)local_7c,(ulong)local_a4,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                  ,0x6d);
    pFVar3 = local_98;
    pppfVar5 = (float32 ***)
               __ckd_calloc_2d__((ulong)local_7c,(ulong)local_a4,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                 ,0x6e);
    if (local_7c != 0) {
      uVar11 = 0;
      local_a0 = pppfVar5;
      local_70 = ppppfVar4;
      local_60 = A;
      local_58 = B;
      do {
        if (local_a4 != 0) {
          uVar12 = 0;
          local_68 = uVar11;
          do {
            puVar1 = local_78;
            puVar8 = local_78 + uVar12;
            __isoc99_fscanf(pFVar3,"%d",puVar8);
            ppfVar6 = (float32 **)
                      __ckd_calloc_2d__((ulong)puVar1[uVar12],(ulong)puVar1[uVar12],4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                        ,0x72);
            ppppfVar4[uVar11][uVar12] = ppfVar6;
            pfVar7 = (float32 *)
                     __ckd_calloc__((ulong)puVar1[uVar12],4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                    ,0x73);
            local_a0[uVar11][uVar12] = pfVar7;
            local_90 = uVar12;
            local_88 = puVar8;
            if (puVar1[uVar12] != 0) {
              uVar11 = 0;
              do {
                uVar12 = local_90;
                pFVar3 = local_98;
                if (*puVar8 != 0) {
                  lVar10 = 0;
                  uVar13 = 0;
                  do {
                    __isoc99_fscanf(pFVar3,"%f ",(long)local_70[local_68][uVar12][uVar11] + lVar10);
                    uVar13 = uVar13 + 1;
                    lVar10 = lVar10 + 4;
                    puVar8 = local_88;
                  } while (uVar13 < *local_88);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < *puVar8);
            }
            uVar11 = local_68;
            uVar12 = local_90;
            pFVar3 = local_98;
            if (*puVar8 != 0) {
              lVar10 = 0;
              uVar13 = 0;
              do {
                __isoc99_fscanf(pFVar3,"%f ",(long)local_a0[uVar11][uVar12] + lVar10);
                uVar13 = uVar13 + 1;
                lVar10 = lVar10 + 4;
                puVar8 = local_88;
              } while (uVar13 < *local_88);
            }
            if (*puVar8 != 0) {
              uVar9 = 0;
              do {
                __isoc99_fscanf(pFVar3,"%f ",local_34);
                uVar9 = uVar9 + 1;
              } while (uVar9 < *local_88);
            }
            uVar12 = local_90 + 1;
            ppppfVar4 = local_70;
          } while (uVar12 < local_a4);
        }
        uVar11 = uVar11 + 1;
        pppfVar5 = local_a0;
        B = local_58;
        A = local_60;
      } while (uVar11 < local_7c);
    }
    *local_40 = local_7c;
    *local_48 = local_a4;
    *local_50 = local_78;
    *A = ppppfVar4;
    *B = pppfVar5;
    fclose(pFVar3);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32
read_reg_mat (
             const char   *regmatfn,
             uint32  **veclen,
             uint32  *n_class,
             uint32  *n_stream,
             float32 *****A,
             float32 ****B
            )
{
    uint32 i,j,k,m,nstream,nclass;
    FILE  *fp;
    uint32 *vlen;
    float32 ****lA,***lB;

    if ((fp = fopen(regmatfn,"r")) == NULL) {
	E_INFO("Unable to open %s to read MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fscanf(fp,"%d",&nclass);
    fscanf(fp,"%d",&nstream);
    vlen = (uint32 *)ckd_calloc(nstream,sizeof(uint32));
    lA = (float32 ****)ckd_calloc_2d (nclass,nstream,sizeof (float32 **));
    lB = (float32 ***)ckd_calloc_2d (nclass,nstream,sizeof (float32 *));
    for (m = 0; m < nclass; ++m) {
	for (i = 0; i < nstream; ++i) {
	    fscanf(fp,"%d", &vlen[i]);
	    lA[m][i] = (float32 **) ckd_calloc_2d(vlen[i],vlen[i],sizeof(float32));
	    lB[m][i] = (float32 *) ckd_calloc(vlen[i],sizeof(float32));
	    for (j = 0; j < vlen[i]; j++) {
		for (k = 0; k < vlen[i]; ++k) {
		    fscanf(fp,"%f ",&lA[m][i][j][k]);
		}
	    }
	    for (j = 0; j < vlen[i]; j++) {
		fscanf(fp,"%f ",&lB[m][i][j]);
	    }
	    /* Identity transform for variances. */
	    for (j = 0; j < vlen[i]; j++) {
		float32 dummy;
		fscanf(fp,"%f ",&dummy);
	    }
	}
    }

    *n_class = nclass;
    *n_stream = nstream;
    *veclen = vlen;
    *A = lA;
    *B = lB;

    fclose(fp);
    return S3_SUCCESS;
}